

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  bool bVar6;
  float fVar7;
  ImVec2 IVar8;
  ImGuiCol local_15c;
  float local_14c;
  float local_144;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  undefined2 local_f7;
  undefined1 local_f5;
  char local_f4 [4];
  char log_suffix [3];
  char log_prefix [4];
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c4;
  ImVec2 local_bc;
  ImVec2 text_pos;
  ImU32 col;
  bool local_a6;
  bool local_a5;
  uint local_a4;
  bool toggled;
  bool pressed;
  bool held;
  bool hovered;
  ImGuiButtonFlags button_flags;
  bool is_open;
  ImRect interact_bb;
  float text_width;
  float text_offset_x;
  ImVec2 local_74;
  undefined1 local_6c [8];
  ImRect bb;
  float frame_height;
  float text_base_offset_y;
  ImVec2 label_size;
  ImVec2 padding;
  bool display_frame;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *label_end_local;
  char *label_local;
  ImGuiID local_10;
  ImGuiTreeNodeFlags flags_local;
  ImGuiID id_local;
  
  local_10 = id;
  pIVar5 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar5->SkipItems & 1U) == 0) {
    bVar6 = (flags & 2U) != 0;
    if (bVar6) {
      label_size = (GImGui->Style).FramePadding;
    }
    else {
      ImVec2::ImVec2(&label_size,(GImGui->Style).FramePadding.x,0.0);
    }
    window = (ImGuiWindow *)label_end;
    if (label_end == (char *)0x0) {
      window = (ImGuiWindow *)FindRenderedTextEnd(label,(char *)0x0);
    }
    _frame_height = CalcTextSize(label,(char *)window,false,-1.0);
    bb.Max.y = ImMax(0.0,(pIVar5->DC).CurrentLineTextBaseOffset - label_size.y);
    fVar7 = (pIVar1->Style).FramePadding.y;
    fVar7 = ImMin((pIVar5->DC).CurrentLineHeight,fVar7 + fVar7 + pIVar1->FontSize);
    bb.Max.x = ImMax(fVar7,label_size.y + label_size.y + text_base_offset_y);
    fVar7 = (pIVar5->Pos).x;
    IVar8 = GetContentRegionMax();
    text_width = IVar8.x;
    ImVec2::ImVec2(&local_74,fVar7 + text_width,(pIVar5->DC).CursorPos.y + bb.Max.x);
    ImRect::ImRect((ImRect *)local_6c,&(pIVar5->DC).CursorPos,&local_74);
    if (bVar6) {
      local_6c._0_4_ = (float)local_6c._0_4_ - ((float)(int)((pIVar5->WindowPadding).x * 0.5) - 1.0)
      ;
      bb.Min.x = ((float)(int)((pIVar5->WindowPadding).x * 0.5) - 1.0) + bb.Min.x;
    }
    if (bVar6) {
      local_144 = label_size.x * 3.0;
    }
    else {
      local_144 = label_size.x * 2.0;
    }
    local_144 = pIVar1->FontSize + local_144;
    if (frame_height <= 0.0) {
      local_14c = 0.0;
    }
    else {
      local_14c = label_size.x + label_size.x + frame_height;
    }
    local_14c = pIVar1->FontSize + local_14c;
    ImVec2::ImVec2(&interact_bb.Max,local_14c,bb.Max.x);
    ItemSize(&interact_bb.Max,bb.Max.y);
    if (bVar6) {
      unique0x100003d4 = (float)local_6c._4_4_;
      button_flags = local_6c._0_4_;
      interact_bb.Min.y = bb.Min.y;
      interact_bb.Min.x = bb.Min.x;
    }
    else {
      fVar7 = (pIVar1->Style).ItemSpacing.x;
      ImRect::ImRect((ImRect *)&button_flags,(float)local_6c._0_4_,(float)local_6c._4_4_,
                     fVar7 + fVar7 + (float)local_6c._0_4_ + local_14c,bb.Min.y);
    }
    hovered = TreeNodeBehaviorIsOpen(local_10,flags);
    bVar2 = ItemAdd((ImRect *)&button_flags,&local_10);
    if (bVar2) {
      local_a4 = 0;
      if ((flags & 4U) != 0) {
        local_a4 = 0x400;
      }
      local_a4 = local_a4 | 0x200;
      if ((flags & 0x40U) != 0) {
        uVar4 = 0;
        if ((flags & 0x80U) != 0) {
          uVar4 = 2;
        }
        local_a4 = uVar4 | 0x10 | local_a4;
      }
      bVar2 = ButtonBehavior((ImRect *)&button_flags,local_10,&local_a5,&local_a6,local_a4);
      if ((bVar2) && ((flags & 0x100U) == 0)) {
        bVar2 = (flags & 0xc0U) == 0;
        if ((flags & 0x80U) != 0) {
          ImVec2::ImVec2((ImVec2 *)&text_pos.y,(float)button_flags + local_144,interact_bb.Min.y);
          bVar3 = IsMouseHoveringRect((ImVec2 *)&button_flags,(ImVec2 *)&text_pos.y,true);
          bVar2 = bVar2 || bVar3;
        }
        if ((flags & 0x40U) != 0) {
          bVar2 = bVar2 || ((pIVar1->IO).MouseDoubleClicked[0] & 1U) != 0;
        }
        if (bVar2) {
          hovered = (bool)((hovered ^ 0xffU) & 1);
          ImGuiStorage::SetInt((pIVar5->DC).StateStorage,local_10,(uint)hovered);
        }
      }
      if ((flags & 4U) != 0) {
        SetItemAllowOverlap();
      }
      if (((local_a6 & 1U) == 0) || ((local_a5 & 1U) == 0)) {
        local_15c = 0x19;
        if ((local_a5 & 1U) != 0) {
          local_15c = 0x1a;
        }
      }
      else {
        local_15c = 0x1b;
      }
      text_pos.x = (float)GetColorU32(local_15c,1.0);
      ImVec2::ImVec2(&local_c4,local_144,label_size.y + bb.Max.y);
      local_bc = operator+((ImVec2 *)local_6c,&local_c4);
      if (bVar6) {
        local_d0.y = (float)local_6c._4_4_;
        local_d0.x = (float)local_6c._0_4_;
        local_d8.y = bb.Min.y;
        local_d8.x = bb.Min.x;
        RenderFrame(local_d0,local_d8,(ImU32)text_pos.x,true,(pIVar1->Style).FrameRounding);
        local_e8 = operator+((ImVec2 *)local_6c,&label_size);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff10,0.0,bb.Max.y);
        local_e0 = operator+(&local_e8,(ImVec2 *)&stack0xffffffffffffff10);
        RenderCollapseTriangle(local_e0,(bool)(hovered & 1),1.0,true);
        if ((pIVar1->LogEnabled & 1U) == 0) {
          RenderTextClipped(&local_bc,&bb.Min,label,(char *)window,(ImVec2 *)&frame_height,9,
                            (ImVec2 *)0x0,(ImVec2 *)0x0);
        }
        else {
          builtin_strncpy(local_f4,"\n##",4);
          local_f7 = 0x2323;
          local_f5 = 0;
          LogRenderedText(&local_bc,local_f4,local_f4 + 3);
          RenderTextClipped(&local_bc,&bb.Min,label,(char *)window,(ImVec2 *)&frame_height,9,
                            (ImVec2 *)0x0,(ImVec2 *)0x0);
          LogRenderedText(&local_bc,(char *)((long)&local_f7 + 1),local_f4);
        }
      }
      else {
        if (((local_a5 & 1U) != 0) || ((flags & 1U) != 0)) {
          local_100.y = (float)local_6c._4_4_;
          local_100.x = (float)local_6c._0_4_;
          local_108.y = bb.Min.y;
          local_108.x = bb.Min.x;
          RenderFrame(local_100,local_108,(ImU32)text_pos.x,false,0.0);
        }
        if ((flags & 0x200U) == 0) {
          if ((flags & 0x100U) == 0) {
            ImVec2::ImVec2(&local_128,label_size.x,pIVar1->FontSize * 0.15 + bb.Max.y);
            local_120 = operator+((ImVec2 *)local_6c,&local_128);
            RenderCollapseTriangle(local_120,(bool)(hovered & 1),0.7,false);
          }
        }
        else {
          ImVec2::ImVec2(&local_118,local_144 * 0.5,pIVar1->FontSize * 0.5 + bb.Max.y);
          local_110 = operator+((ImVec2 *)local_6c,&local_118);
          RenderBullet(local_110);
        }
        if ((pIVar1->LogEnabled & 1U) != 0) {
          LogRenderedText(&local_bc,">",(char *)0x0);
        }
        RenderText(local_bc,label,(char *)window,false);
      }
      if (((hovered & 1U) != 0) && ((flags & 8U) == 0)) {
        TreePushRawID(local_10);
      }
      flags_local._3_1_ = (bool)(hovered & 1);
    }
    else {
      if (((hovered & 1U) != 0) && ((flags & 8U) == 0)) {
        TreePushRawID(local_10);
      }
      flags_local._3_1_ = (bool)(hovered & 1);
    }
  }
  else {
    flags_local._3_1_ = false;
  }
  return flags_local._3_1_;
}

Assistant:

bool ImGui::TreeNodeBehavior(ImGuiID id, ImGuiTreeNodeFlags flags, const char* label, const char* label_end)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const bool display_frame = (flags & ImGuiTreeNodeFlags_Framed) != 0;
    const ImVec2 padding = display_frame ? style.FramePadding : ImVec2(style.FramePadding.x, 0.0f);

    if (!label_end)
        label_end = FindRenderedTextEnd(label);
    const ImVec2 label_size = CalcTextSize(label, label_end, false);

    // We vertically grow up to current line height up the typical widget height.
    const float text_base_offset_y = ImMax(0.0f, window->DC.CurrentLineTextBaseOffset - padding.y); // Latch before ItemSize changes it
    const float frame_height = ImMax(ImMin(window->DC.CurrentLineHeight, g.FontSize + style.FramePadding.y*2), label_size.y + padding.y*2);
    ImRect bb = ImRect(window->DC.CursorPos, ImVec2(window->Pos.x + GetContentRegionMax().x, window->DC.CursorPos.y + frame_height));
    if (display_frame)
    {
        // Framed header expand a little outside the default padding
        bb.Min.x -= (float)(int)(window->WindowPadding.x*0.5f) - 1;
        bb.Max.x += (float)(int)(window->WindowPadding.x*0.5f) - 1;
    }

    const float text_offset_x = (g.FontSize + (display_frame ? padding.x*3 : padding.x*2));   // Collapser arrow width + Spacing
    const float text_width = g.FontSize + (label_size.x > 0.0f ? label_size.x + padding.x*2 : 0.0f);   // Include collapser
    ItemSize(ImVec2(text_width, frame_height), text_base_offset_y);

    // For regular tree nodes, we arbitrary allow to click past 2 worth of ItemSpacing
    // (Ideally we'd want to add a flag for the user to specify we want want the hit test to be done up to the right side of the content or not)
    const ImRect interact_bb = display_frame ? bb : ImRect(bb.Min.x, bb.Min.y, bb.Min.x + text_width + style.ItemSpacing.x*2, bb.Max.y);
    bool is_open = TreeNodeBehaviorIsOpen(id, flags);
    if (!ItemAdd(interact_bb, &id))
    {
        if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
            TreePushRawID(id);
        return is_open;
    }

    // Flags that affects opening behavior:
    // - 0(default) ..................... single-click anywhere to open
    // - OpenOnDoubleClick .............. double-click anywhere to open
    // - OpenOnArrow .................... single-click on arrow to open
    // - OpenOnDoubleClick|OpenOnArrow .. single-click on arrow or double-click anywhere to open
    ImGuiButtonFlags button_flags = ImGuiButtonFlags_NoKeyModifiers | ((flags & ImGuiTreeNodeFlags_AllowOverlapMode) ? ImGuiButtonFlags_AllowOverlapMode : 0);
    if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
        button_flags |= ImGuiButtonFlags_PressedOnDoubleClick | ((flags & ImGuiTreeNodeFlags_OpenOnArrow) ? ImGuiButtonFlags_PressedOnClickRelease : 0);
    bool hovered, held, pressed = ButtonBehavior(interact_bb, id, &hovered, &held, button_flags);
    if (pressed && !(flags & ImGuiTreeNodeFlags_Leaf))
    {
        bool toggled = !(flags & (ImGuiTreeNodeFlags_OpenOnArrow | ImGuiTreeNodeFlags_OpenOnDoubleClick));
        if (flags & ImGuiTreeNodeFlags_OpenOnArrow)
            toggled |= IsMouseHoveringRect(interact_bb.Min, ImVec2(interact_bb.Min.x + text_offset_x, interact_bb.Max.y));
        if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
            toggled |= g.IO.MouseDoubleClicked[0];
        if (toggled)
        {
            is_open = !is_open;
            window->DC.StateStorage->SetInt(id, is_open);
        }
    }
    if (flags & ImGuiTreeNodeFlags_AllowOverlapMode)
        SetItemAllowOverlap();

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
    const ImVec2 text_pos = bb.Min + ImVec2(text_offset_x, padding.y + text_base_offset_y);
    if (display_frame)
    {
        // Framed type
        RenderFrame(bb.Min, bb.Max, col, true, style.FrameRounding);
        RenderCollapseTriangle(bb.Min + padding + ImVec2(0.0f, text_base_offset_y), is_open, 1.0f, true);
        if (g.LogEnabled)
        {
            // NB: '##' is normally used to hide text (as a library-wide feature), so we need to specify the text range to make sure the ## aren't stripped out here.
            const char log_prefix[] = "\n##";
            const char log_suffix[] = "##";
            LogRenderedText(text_pos, log_prefix, log_prefix+3);
            RenderTextClipped(text_pos, bb.Max, label, label_end, &label_size);
            LogRenderedText(text_pos, log_suffix+1, log_suffix+3);
        }
        else
        {
            RenderTextClipped(text_pos, bb.Max, label, label_end, &label_size);
        }
    }
    else
    {
        // Unframed typed for tree nodes
        if (hovered || (flags & ImGuiTreeNodeFlags_Selected))
            RenderFrame(bb.Min, bb.Max, col, false);

        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(bb.Min + ImVec2(text_offset_x * 0.5f, g.FontSize*0.50f + text_base_offset_y));
        else if (!(flags & ImGuiTreeNodeFlags_Leaf))
            RenderCollapseTriangle(bb.Min + ImVec2(padding.x, g.FontSize*0.15f + text_base_offset_y), is_open, 0.70f, false);
        if (g.LogEnabled)
            LogRenderedText(text_pos, ">");
        RenderText(text_pos, label, label_end, false);
    }

    if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        TreePushRawID(id);
    return is_open;
}